

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O3

void __thiscall duckdb::StorageLock::StorageLock(StorageLock *this)

{
  shared_ptr<duckdb::StorageLockInternals> local_20;
  
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_M_use_count = 1;
  (local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_M_weak_count = 1;
  (local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02450730;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._M_use_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._M_weak_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._M_use_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[2]._M_weak_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[3]._M_use_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[3]._M_weak_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[4]._M_use_count = 0;
  local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[4]._M_weak_count = 0;
  shared_ptr<duckdb::StorageLockInternals,_true>::shared_ptr(&this->internals,&local_20);
  if (local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

StorageLock::StorageLock() : internals(make_shared_ptr<StorageLockInternals>()) {
}